

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalKdevelopGenerator::Generate(cmGlobalKdevelopGenerator *this)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  cmGlobalGenerator *pcVar3;
  long *plVar4;
  cmGlobalKdevelopGenerator *this_01;
  _Base_ptr p_Var5;
  string fileToOpen;
  string executable;
  string projectDir;
  string outputDir;
  string cmakeFilePattern;
  string projectName;
  allocator local_121;
  _Base_ptr local_120;
  string local_118;
  cmGlobalKdevelopGenerator *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  pcVar3 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  local_120 = (pcVar3->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f8 = this;
  do {
    if ((_Rb_tree_header *)local_120 == &(pcVar3->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    this_00 = *(cmMakefile **)(**(long **)(local_120 + 2) + 0x28);
    pcVar2 = cmMakefile::GetCurrentBinaryDirectory(this_00);
    std::__cxx11::string::string((string *)&local_b0,pcVar2,(allocator *)&local_d0);
    pcVar2 = cmMakefile::GetHomeDirectory(this_00);
    std::__cxx11::string::string((string *)&local_d0,pcVar2,(allocator *)&local_50);
    std::__cxx11::string::string
              ((string *)&local_50,(this_00->ProjectName)._M_dataplus._M_p,(allocator *)local_90);
    this_01 = (cmGlobalKdevelopGenerator *)local_90;
    std::__cxx11::string::string
              ((string *)local_90,"CMakeLists.txt;*.cmake;",(allocator *)&local_118);
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    bVar1 = CreateFilelistFile(this_01,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                        *)(local_120 + 2),&local_b0,&local_d0,&local_50,
                               (string *)local_90,&local_118);
    if (bVar1) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      local_f0._M_string_length = 0;
      local_f0.field_2._M_local_buf[0] = '\0';
      for (p_Var5 = *(_Base_ptr *)(local_120 + 2); p_Var5 != local_120[2]._M_parent;
          p_Var5 = (_Base_ptr)&p_Var5->_M_parent) {
        plVar4 = (long *)(*(long *)(*(long *)p_Var5 + 0x28) + 0x68);
        do {
          plVar4 = (long *)*plVar4;
          if (plVar4 == (long *)0x0) goto LAB_002ddb12;
        } while (*(int *)(plVar4 + 0x61) != 0);
        std::__cxx11::string::string((string *)(local_90 + 0x20),"",&local_121);
        cmTarget::GetLocation((cmTarget *)(plVar4 + 5),(string *)(local_90 + 0x20));
        std::__cxx11::string::assign((char *)&local_f0);
        std::__cxx11::string::~string((string *)(local_90 + 0x20));
        if (local_f0._M_string_length != 0) break;
LAB_002ddb12:
      }
      this = local_f8;
      CreateProjectFile(local_f8,&local_b0,&local_d0,&local_50,&local_f0,(string *)local_90,
                        &local_118);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    else {
      cmSystemTools::Error("Can not create filelist file",(char *)0x0,(char *)0x0,(char *)0x0);
    }
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (!bVar1) {
      return;
    }
    local_120 = (_Base_ptr)std::_Rb_tree_increment(local_120);
    pcVar3 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  } while( true );
}

Assistant:

void cmGlobalKdevelopGenerator::Generate()
{
  // for each sub project in the project create
  // a kdevelop project
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
      it!= this->GlobalGenerator->GetProjectMap().end();
      ++it)
    {
    cmMakefile* mf = it->second[0]->GetMakefile();
    std::string outputDir=mf->GetCurrentBinaryDirectory();
    std::string projectDir=mf->GetHomeDirectory();
    std::string projectName=mf->GetProjectName();
    std::string cmakeFilePattern("CMakeLists.txt;*.cmake;");
    std::string fileToOpen;
    const std::vector<cmLocalGenerator*>& lgs= it->second;
    // create the project.kdevelop.filelist file
    if(!this->CreateFilelistFile(lgs, outputDir, projectDir,
                                 projectName, cmakeFilePattern, fileToOpen))
      {
      cmSystemTools::Error("Can not create filelist file");
      return;
      }
    //try to find the name of an executable so we have something to
    //run from kdevelop for now just pick the first executable found
    std::string executable;
    for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
         lg!=lgs.end(); lg++)
      {
      cmMakefile* makefile=(*lg)->GetMakefile();
      cmTargets& targets=makefile->GetTargets();
      for (cmTargets::iterator ti = targets.begin();
           ti != targets.end(); ti++)
        {
        if (ti->second.GetType()==cmTarget::EXECUTABLE)
          {
          executable = ti->second.GetLocation("");
          break;
          }
        }
      if (!executable.empty())
        {
        break;
        }
      }

    // now create a project file
    this->CreateProjectFile(outputDir, projectDir, projectName,
                            executable, cmakeFilePattern, fileToOpen);
    }
}